

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O1

void __thiscall QTreeWidgetItem::insertChild(QTreeWidgetItem *this,int index,QTreeWidgetItem *child)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  QTreeModel *__s;
  QTreeWidgetItem *pQVar4;
  iterator iVar5;
  ulong uVar6;
  QTreeModel *this_00;
  ulong i;
  long in_FS_OFFSET;
  QTreeModel *local_58;
  undefined1 *puStack_50;
  QTreeWidgetItem *local_48;
  QTreeWidgetItem *local_40;
  Data *local_38;
  
  local_38 = *(Data **)(in_FS_OFFSET + 0x28);
  if ((((-1 < index) && (child != (QTreeWidgetItem *)0x0)) &&
      (i = (ulong)(uint)index, i <= (ulong)(this->children).d.size)) &&
     ((child->view == (QTreeWidget *)0x0 && (child->par == (QTreeWidgetItem *)0x0)))) {
    this_00 = (QTreeModel *)&this->children;
    __s = treeModel(this,(QTreeWidget *)0x0);
    if (__s == (QTreeModel *)0x0) {
      child->par = this;
      QList<QTreeWidgetItem_*>::insert((QList<QTreeWidgetItem_*> *)this_00,i,child);
    }
    else {
      bVar1 = __s->skipPendingSort;
      __s->skipPendingSort = true;
      pQVar4 = (QTreeWidgetItem *)0x0;
      if (__s->rootItem != this) {
        pQVar4 = this;
      }
      child->par = pQVar4;
      bVar2 = QTreeView::isSortingEnabled(&this->view->super_QTreeView);
      if ((bVar2) && ((__s->sortPendingTimer).m_id == Invalid)) {
        QBasicTimer::start(&__s->sortPendingTimer,0,1,__s);
      }
      local_48 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      local_58 = (QTreeModel *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QTreeModel::index((QTreeModel *)&local_58,(char *)__s,(int)this);
      QAbstractItemModel::beginInsertRows((QModelIndex *)__s,(int)(QTreeModel *)&local_58,index);
      local_58 = (QTreeModel *)0xffffffffffffffff;
      puStack_50 = (undefined1 *)0x0;
      local_48 = (QTreeWidgetItem *)0x0;
      iVar3 = (**(code **)(*(long *)__s + 0x80))(__s);
      local_58 = (QTreeModel *)0x0;
      puStack_50 = (undefined1 *)0x0;
      local_48 = (QTreeWidgetItem *)0x0;
      local_40 = child;
      QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,0,&local_40);
      QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
      if (local_48 != (QTreeWidgetItem *)0x0) {
        do {
          iVar5 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
          pQVar4 = iVar5.i[-1];
          local_48 = (QTreeWidgetItem *)&local_48[-1].field_0x5f;
          pQVar4->view = this->view;
          QList<QList<QWidgetItemData>_>::reserve(&pQVar4->values,(long)iVar3);
          if ((pQVar4->children).d.size != 0) {
            uVar6 = 0;
            do {
              local_40 = (pQVar4->children).d.ptr[uVar6];
              QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                        ((QPodArrayOps<QTreeWidgetItem*> *)&local_58,(qsizetype)local_48,&local_40);
              QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)&local_58);
              uVar6 = uVar6 + 1;
            } while (uVar6 < (ulong)(pQVar4->children).d.size);
          }
        } while (local_48 != (QTreeWidgetItem *)0x0);
      }
      local_40 = child;
      QtPrivate::QPodArrayOps<QTreeWidgetItem*>::emplace<QTreeWidgetItem*&>
                ((QPodArrayOps<QTreeWidgetItem*> *)this_00,i,&local_40);
      QList<QTreeWidgetItem_*>::begin((QList<QTreeWidgetItem_*> *)this_00);
      QTreeWidgetItemPrivate::updateHiddenStatus((QTreeWidgetItemPrivate *)this_00,child,true);
      this_00 = __s;
      QAbstractItemModel::endInsertRows();
      if (local_58 != (QTreeModel *)0x0) {
        LOCK();
        *(int *)local_58 = *(int *)local_58 + -1;
        UNLOCK();
        if (*(int *)local_58 == 0) {
          this_00 = local_58;
          QArrayData::deallocate((QArrayData *)local_58,8,0x10);
        }
      }
      __s->skipPendingSort = bVar1;
    }
    if (child->par != (QTreeWidgetItem *)0x0) {
      QTreeWidgetItemPrivate::propagateDisabled((QTreeWidgetItemPrivate *)this_00,child);
    }
  }
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidgetItem::insertChild(int index, QTreeWidgetItem *child)
{
    if (index < 0 || index > children.size() || child == nullptr || child->view != nullptr || child->par != nullptr)
        return;

    if (QTreeModel *model = treeModel()) {
        QTreeModel::SkipSorting skipSorting(model);
        if (model->rootItem == this)
            child->par = nullptr;
        else
            child->par = this;
        if (view->isSortingEnabled()) {
            // do a delayed sort instead
            if (!model->sortPendingTimer.isActive())
                model->sortPendingTimer.start(0, model);
        }
        model->beginInsertItems(this, index, 1);
        int cols = model->columnCount();
        QStack<QTreeWidgetItem*> stack;
        stack.push(child);
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = view;
            i->values.reserve(cols);
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        children.insert(index, child);
        d->updateHiddenStatus(child, true);
        model->endInsertItems();
    } else {
        child->par = this;
        children.insert(index, child);
    }
    if (child->par)
        d->propagateDisabled(child);
}